

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O0

void __thiscall
Outputs::Speaker::PullLowpass<Atari2600::TIASound>::~PullLowpass
          (PullLowpass<Atari2600::TIASound> *this)

{
  PullLowpass<Atari2600::TIASound> *this_local;
  
  ~PullLowpass(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

PullLowpass(SampleSource &sample_source) : sample_source_(sample_source) {
			// Propagate an initial volume level.
			sample_source.set_sample_volume_range(32767);
		}